

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embed.h
# Opt level: O1

void pybind11::finalize_interpreter(void)

{
  internals *this;
  bool bVar1;
  object *poVar2;
  internals **ppiVar3;
  bool bVar4;
  char *id;
  handle builtins;
  object local_80;
  handle local_78;
  handle local_70;
  char *local_68;
  undefined8 local_60;
  item_accessor local_58;
  item_accessor local_38;
  
  local_60 = PyEval_GetBuiltins();
  ppiVar3 = detail::get_internals_pp()::internals_pp;
  local_68 = "__pybind11_internals_v4_clang_libstdcpp_cxxabi1002__";
  bVar1 = detail::object_api<pybind11::handle>::contains<char_const*&>
                    ((object_api<pybind11::handle> *)&local_60,&local_68);
  if (bVar1) {
    detail::object_api<pybind11::handle>::operator[]
              (&local_38,(object_api<pybind11::handle> *)&local_60,local_68);
    poVar2 = detail::accessor<pybind11::detail::accessor_policies::generic_item>::get_cache
                       (&local_38);
    local_70.m_ptr = (poVar2->super_handle).m_ptr;
    if (local_70.m_ptr != (PyObject *)0x0) {
      (local_70.m_ptr)->ob_refcnt = (local_70.m_ptr)->ob_refcnt + 1;
      bVar4 = (local_70.m_ptr)->ob_type == (PyTypeObject *)&PyCapsule_Type;
      goto LAB_0011155a;
    }
  }
  bVar4 = false;
LAB_0011155a:
  if (bVar1) {
    object::~object((object *)&local_70);
    object::~object(&local_38.cache);
    object::~object(&local_38.key);
  }
  if (bVar4) {
    detail::object_api<pybind11::handle>::operator[]
              (&local_58,(object_api<pybind11::handle> *)&local_60,local_68);
    poVar2 = detail::accessor<pybind11::detail::accessor_policies::generic_item>::get_cache
                       (&local_58);
    local_78.m_ptr = (poVar2->super_handle).m_ptr;
    if (local_78.m_ptr != (PyObject *)0x0) {
      (local_78.m_ptr)->ob_refcnt = (local_78.m_ptr)->ob_refcnt + 1;
    }
    local_80.super_handle.m_ptr = (handle)(PyObject *)0x0;
    ppiVar3 = capsule::operator_cast_to_internals__((capsule *)&local_78);
    object::~object((object *)&local_78);
    object::~object(&local_80);
    object::~object(&local_58.cache);
    object::~object(&local_58.key);
  }
  Py_Finalize();
  if (ppiVar3 != (internals **)0x0) {
    this = *ppiVar3;
    if (this != (internals *)0x0) {
      detail::internals::~internals(this);
      operator_delete(this,0x1d8);
    }
    *ppiVar3 = (internals *)0x0;
  }
  return;
}

Assistant:

inline void finalize_interpreter() {
    handle builtins(PyEval_GetBuiltins());
    const char *id = PYBIND11_INTERNALS_ID;

    // Get the internals pointer (without creating it if it doesn't exist).  It's possible for the
    // internals to be created during Py_Finalize() (e.g. if a py::capsule calls `get_internals()`
    // during destruction), so we get the pointer-pointer here and check it after Py_Finalize().
    detail::internals **internals_ptr_ptr = detail::get_internals_pp();
    // It could also be stashed in builtins, so look there too:
    if (builtins.contains(id) && isinstance<capsule>(builtins[id]))
        internals_ptr_ptr = capsule(builtins[id]);

    Py_Finalize();

    if (internals_ptr_ptr) {
        delete *internals_ptr_ptr;
        *internals_ptr_ptr = nullptr;
    }
}